

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

void titlepic(void)

{
  byte bVar1;
  uint cord;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  uint cord_00;
  FILE *title;
  uint blue;
  uint green;
  uint red;
  uint d;
  uint c;
  int vvert;
  int vert;
  int horz;
  
  title._6_2_ = 0x3f;
  title._4_2_ = 0;
  title._2_2_ = 0;
  __stream = fopen("data/title.bmp","rb");
  if (__stream == (FILE *)0x0) {
    printf("Titlepic fileopen Error");
    coniogetch();
    exit(1);
  }
  bVar1 = peekb(0x40,0x17);
  pokeb(0x40,0x17,bVar1 | 0x40);
  for (blue = 0x8000; blue != 0; blue = blue - 1) {
    iVar3 = getc(__stream);
    pic_temp_ram[(int)(blue - 1)] = (ubyte)iVar3;
  }
  for (blue = 0; blue < 0x10; blue = blue + 1) {
    setrgbpalette((uint)blue,(uint)blue << 2,(uint)blue << 2,(uint)blue << 2);
    setpalette((ubyte)blue,(ubyte)blue);
  }
  setrgbpalette(0xf,0x3f,0,0);
  setpalette('\x0f','\x0f');
  _d = 0;
  blue = 0x28a;
  uVar2 = 0;
  do {
    if (199 < (int)_d) {
      switch(0x10fb40) {
      case 0:
        title._4_2_ = 4;
        break;
      case 1:
        title._6_2_ = 0x3b;
        break;
      case 2:
        title._2_2_ = 4;
        break;
      case 3:
        title._4_2_ = 0xfffc;
        break;
      case 4:
        title._2_2_ = 0xfffc;
        title._6_2_ = 0x43;
      }
      setrgbpalette(0xf,(uint)title._6_2_,(uint)title._4_2_,(uint)title._2_2_);
      setpalette('\x0f','\x0f');
      delay(10);
      coniogetch();
      return;
    }
    cord = uVar2 + 1;
    if ((_d & 3) != 0) {
      cord = uVar2 + 2;
    }
    for (vvert = 0x280; vvert != 0; vvert = vvert + -4) {
      uVar2 = (uint)vvert;
      putpixel(uVar2,cord,(int)(uint)pic_temp_ram[blue] >> 4);
      putpixel(uVar2 + 1,cord,(int)(uint)pic_temp_ram[blue] >> 4);
      putpixel(uVar2 + 2,cord,pic_temp_ram[blue] & 0xf);
      putpixel(uVar2 + 3,cord,pic_temp_ram[blue] & 0xf);
      if ((_d & 3) != 0) {
        cord_00 = cord - 1;
        putpixel(uVar2,cord_00,(int)(uint)pic_temp_ram[blue] >> 4);
        putpixel(uVar2 + 1,cord_00,(int)(uint)pic_temp_ram[blue] >> 4);
        putpixel(uVar2 + 2,cord_00,pic_temp_ram[blue] & 0xf);
        putpixel(uVar2 + 3,cord_00,pic_temp_ram[blue] & 0xf);
      }
      iVar3 = kbhit();
      if (iVar3 != 0) {
        coniogetch();
        return;
      }
      blue = blue + 1;
    }
    _d = _d + 1;
    uVar2 = cord;
  } while( true );
}

Assistant:

void titlepic(void) {                     // the title picture display
    // display function
    int horz, vert;
    int vvert = 0;
    uint c, d = 0;
    uint red = 63, green = 0, blue = 0;

    FILE *title;

    if ((title = fopen("data/title.bmp", "rb")) == NULL) {
        printf("Titlepic fileopen Error");
        coniogetch();                            // open the picture file
        exit(1);
    };

    pokeb(0x0040, 0x0017, peekb(0x0040, 0x0017) | 0x40); // turn on capslock

    for (c = 0x8000; c; c--) {                          // load the picture
        pic_temp_ram[c - 1] = getc(title);
    }

    for (c = 0; c < 16; c++) {                            // initialise the palette
        setrgbpalette(c, c << 2, c << 2, c << 2);             // for greyscale
        setpalette(c, c);
    }

    setrgbpalette(15, 63, 0, 0);                       // set the red colour
    setpalette(15, 15);

    for (vert = 0, c = 650; vert < 200; vert++) {            // loop through each
        vvert++;                                     // pixel row

        if (vert & 0x3) vvert++;                       // scale output to fit
        // screen
        for (horz = 640; horz; horz -= 4, c++) {

            putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
            putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);

            if (vert & 0x3) { // if y cord has been scaled, draw on original line
                vvert--;
                putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
                putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);
                vvert++;
            }
            if (kbhit()) {
                coniogetch();
                return;
            }  // wait for keypress
        }
    }

    for (; ;)                             // cycle colours until
        for (c = 0; c <= 4; c++)
            for (d = 0; d < 15; d++) {
                switch (c) {
                    case 0:
                        green += 4;
                        break;
                    case 1:
                        red -= 4;
                        break;
                    case 2:
                        blue += 4;
                        break;
                    case 3:
                        green -= 4;
                        break;
                    case 4:
                        blue -= 4;
                        red += 4;
                        break;
                }
                setrgbpalette(15, red, green, blue);
                setpalette(15, 15);
                delay(10);                        // delay deliberately
                if (1 /*kbhit() */) {   // TODO no point waiting for press any key to continue
                    coniogetch();
                    return;
                }   // until keypressed
            }
}